

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

string * __thiscall
cmMakefile::ExpandVariablesInString
          (cmMakefile *this,string *source,bool escapeQuotes,bool noEscapes,bool atOnly,
          char *filename,long line,bool removeEmpty,bool replaceAt)

{
  bool bVar1;
  PolicyStatus PVar2;
  MessageType MVar3;
  PolicyID id;
  bool bVar4;
  string msg;
  string msg_new;
  string newResult;
  string msg_input;
  string errorstr;
  string msg_old;
  string newErrorstr;
  string original;
  
  errorstr._M_dataplus._M_p = (pointer)&errorstr.field_2;
  errorstr._M_string_length = 0;
  original._M_dataplus._M_p = (pointer)&original.field_2;
  original._M_string_length = 0;
  errorstr.field_2._M_local_buf[0] = '\0';
  original.field_2._M_local_buf[0] = '\0';
  if ((!noEscapes || !removeEmpty) && atOnly) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg_input,
               "ExpandVariablesInString @ONLY called on something with escapes.",
               (allocator<char> *)&msg_old);
    IssueMessage(this,INTERNAL_ERROR,&msg_input);
    std::__cxx11::string::~string((string *)&msg_input);
    goto LAB_0024963c;
  }
  newResult._M_dataplus._M_p = (pointer)&newResult.field_2;
  newResult._M_string_length = 0;
  newErrorstr._M_dataplus._M_p = (pointer)&newErrorstr.field_2;
  newErrorstr._M_string_length = 0;
  newResult.field_2._M_local_buf[0] = '\0';
  newErrorstr.field_2._M_local_buf[0] = '\0';
  PVar2 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0053,false);
  if (PVar2 - NEW < 3) {
    MVar3 = ExpandVariablesInStringNew
                      (this,&errorstr,source,escapeQuotes,noEscapes,atOnly,filename,line,replaceAt);
    bVar4 = true;
    bVar1 = false;
LAB_002493ad:
    if (MVar3 == LOG) {
      if (bVar1) {
        bVar1 = std::operator!=(&newResult,source);
        if ((bVar1) || (!bVar4)) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&msg_new,(cmPolicies *)0x35,id);
          msg_input._M_dataplus._M_p = (pointer)msg_new._M_string_length;
          msg_input._M_string_length = (size_type)msg_new._M_dataplus._M_p;
          msg_old._M_string_length = (size_type)&msg_old.field_2;
          msg_old._M_dataplus._M_p = &DAT_00000001;
          msg_old.field_2._M_local_buf[0] = '\n';
          cmStrCat<>(&msg,(cmAlphaNum *)&msg_input,(cmAlphaNum *)&msg_old);
          std::__cxx11::string::~string((string *)&msg_new);
          std::__cxx11::string::string((string *)&msg_input,(string *)&original);
          cmsys::SystemTools::ReplaceString(&msg_input,"\n","\n  ");
          std::__cxx11::string::append((char *)&msg);
          std::__cxx11::string::append((string *)&msg);
          std::__cxx11::string::append((char *)&msg);
          std::__cxx11::string::string((string *)&msg_old,(string *)source);
          cmsys::SystemTools::ReplaceString(&msg_old,"\n","\n  ");
          std::__cxx11::string::append((char *)&msg);
          std::__cxx11::string::append((string *)&msg);
          std::__cxx11::string::append((char *)&msg);
          if (bVar4) {
            std::__cxx11::string::string((string *)&msg_new,(string *)&newResult);
            cmsys::SystemTools::ReplaceString(&msg_new,"\n","\n  ");
            std::__cxx11::string::append((char *)&msg);
            std::__cxx11::string::append((string *)&msg);
            std::__cxx11::string::append((char *)&msg);
          }
          else {
            std::__cxx11::string::string((string *)&msg_new,(string *)&newErrorstr);
            cmsys::SystemTools::ReplaceString(&msg_new,"\n","\n  ");
            std::__cxx11::string::append((char *)&msg);
            std::__cxx11::string::append((string *)&msg);
            std::__cxx11::string::append((char *)&msg);
          }
          std::__cxx11::string::~string((string *)&msg_new);
          std::__cxx11::string::append((char *)&msg);
          IssueMessage(this,AUTHOR_WARNING,&msg);
          std::__cxx11::string::~string((string *)&msg_old);
          std::__cxx11::string::~string((string *)&msg_input);
          std::__cxx11::string::~string((string *)&msg);
        }
      }
    }
    else {
      if (MVar3 == FATAL_ERROR) {
        cmSystemTools::s_FatalErrorOccurred = true;
      }
      IssueMessage(this,MVar3,&errorstr);
    }
  }
  else {
    if (PVar2 == OLD) {
      bVar4 = true;
      bVar1 = false;
LAB_0024937f:
      MVar3 = ExpandVariablesInStringOld
                        (this,&errorstr,source,escapeQuotes,noEscapes,atOnly,filename,line,
                         removeEmpty,true);
      goto LAB_002493ad;
    }
    if (PVar2 == WARN) {
      std::__cxx11::string::_M_assign((string *)&original);
      std::__cxx11::string::_M_assign((string *)&newResult);
      this->SuppressSideEffects = true;
      MVar3 = ExpandVariablesInStringNew
                        (this,&newErrorstr,&newResult,escapeQuotes,noEscapes,atOnly,filename,line,
                         replaceAt);
      this->SuppressSideEffects = false;
      bVar4 = MVar3 == LOG;
      bVar1 = true;
      goto LAB_0024937f;
    }
  }
  std::__cxx11::string::~string((string *)&newErrorstr);
  std::__cxx11::string::~string((string *)&newResult);
LAB_0024963c:
  std::__cxx11::string::~string((string *)&original);
  std::__cxx11::string::~string((string *)&errorstr);
  return source;
}

Assistant:

const std::string& cmMakefile::ExpandVariablesInString(
  std::string& source, bool escapeQuotes, bool noEscapes, bool atOnly,
  const char* filename, long line, bool removeEmpty, bool replaceAt) const
{
  bool compareResults = false;
  MessageType mtype = MessageType::LOG;
  std::string errorstr;
  std::string original;

  // Sanity check the @ONLY mode.
  if (atOnly && (!noEscapes || !removeEmpty)) {
    // This case should never be called.  At-only is for
    // configure-file/string which always does no escapes.
    this->IssueMessage(MessageType::INTERNAL_ERROR,
                       "ExpandVariablesInString @ONLY called "
                       "on something with escapes.");
    return source;
  }

  // Variables used in the WARN case.
  std::string newResult;
  std::string newErrorstr;
  MessageType newError = MessageType::LOG;

  switch (this->GetPolicyStatus(cmPolicies::CMP0053)) {
    case cmPolicies::WARN: {
      // Save the original string for the warning.
      original = source;
      newResult = source;
      compareResults = true;
      // Suppress variable watches to avoid calling hooks twice. Suppress new
      // dereferences since the OLD behavior is still what is actually used.
      this->SuppressSideEffects = true;
      newError = this->ExpandVariablesInStringNew(
        newErrorstr, newResult, escapeQuotes, noEscapes, atOnly, filename,
        line, replaceAt);
      this->SuppressSideEffects = false;
      CM_FALLTHROUGH;
    }
    case cmPolicies::OLD:
      mtype = this->ExpandVariablesInStringOld(errorstr, source, escapeQuotes,
                                               noEscapes, atOnly, filename,
                                               line, removeEmpty, true);
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    // Messaging here would be *very* verbose.
    case cmPolicies::NEW:
      mtype = this->ExpandVariablesInStringNew(errorstr, source, escapeQuotes,
                                               noEscapes, atOnly, filename,
                                               line, replaceAt);
      break;
  }

  // If it's an error in either case, just report the error...
  if (mtype != MessageType::LOG) {
    if (mtype == MessageType::FATAL_ERROR) {
      cmSystemTools::SetFatalErrorOccurred();
    }
    this->IssueMessage(mtype, errorstr);
  }
  // ...otherwise, see if there's a difference that needs to be warned about.
  else if (compareResults && (newResult != source || newError != mtype)) {
    std::string msg =
      cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0053), '\n');

    std::string msg_input = original;
    cmSystemTools::ReplaceString(msg_input, "\n", "\n  ");
    msg += "For input:\n  '";
    msg += msg_input;
    msg += "'\n";

    std::string msg_old = source;
    cmSystemTools::ReplaceString(msg_old, "\n", "\n  ");
    msg += "the old evaluation rules produce:\n  '";
    msg += msg_old;
    msg += "'\n";

    if (newError == mtype) {
      std::string msg_new = newResult;
      cmSystemTools::ReplaceString(msg_new, "\n", "\n  ");
      msg += "but the new evaluation rules produce:\n  '";
      msg += msg_new;
      msg += "'\n";
    } else {
      std::string msg_err = newErrorstr;
      cmSystemTools::ReplaceString(msg_err, "\n", "\n  ");
      msg += "but the new evaluation rules produce an error:\n  ";
      msg += msg_err;
      msg += "\n";
    }

    msg +=
      "Using the old result for compatibility since the policy is not set.";

    this->IssueMessage(MessageType::AUTHOR_WARNING, msg);
  }

  return source;
}